

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutOracle.c
# Opt level: O1

void Cut_OracleNodeSetTriv(Cut_Oracle_t *p,int Node)

{
  Vec_Ptr_t *pVVar1;
  Cut_Cut_t *pCVar2;
  
  if (-1 < Node) {
    pVVar1 = p->vCutsNew;
    if (Node < pVVar1->nSize) {
      if (pVVar1->pArray[(uint)Node] != (void *)0x0) {
        __assert_fail("Vec_PtrEntry( p->vCutsNew, Node ) == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/cut/cutOracle.c"
                      ,0xc2,"void Cut_OracleNodeSetTriv(Cut_Oracle_t *, int)");
      }
      pCVar2 = Cut_CutTriv(p,Node);
      if (Node < pVVar1->nSize) {
        pVVar1->pArray[(uint)Node] = pCVar2;
        return;
      }
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                    ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

void Cut_OracleNodeSetTriv( Cut_Oracle_t * p, int Node )
{
    assert( Vec_PtrEntry( p->vCutsNew, Node ) == NULL );
    Vec_PtrWriteEntry( p->vCutsNew, Node, Cut_CutTriv(p, Node) );
}